

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,ExpListNode *expListNode)

{
  ExpNode *pEVar1;
  ExpListNode *pEVar2;
  
  pEVar1 = expListNode->exp;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
  }
  pEVar2 = expListNode->next;
  if (pEVar2 != (ExpListNode *)0x0) {
    (*(pEVar2->super_ASTNode)._vptr_ASTNode[3])(pEVar2,this);
    return;
  }
  return;
}

Assistant:

void SemanticTypes::visit(ExpListNode *expListNode) {
    if (expListNode->getExp()) {
        expListNode->getExp()->accept(this);
    }
    if (expListNode->getNext()) {
        expListNode->getNext()->accept(this);
    }
}